

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh.cpp
# Opt level: O3

bool __thiscall phyr::AccelBVH::intersectRay(AccelBVH *this,Ray *ray,SurfaceInteraction *si)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  LinearBVHNode *pLVar4;
  element_type *peVar5;
  undefined1 auVar6 [12];
  undefined1 auVar7 [16];
  double dVar8;
  double dVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  byte bVar13;
  int iVar14;
  long lVar15;
  ulong uVar16;
  int iVar17;
  ulong uVar18;
  ulong uVar19;
  bool bVar20;
  long lVar21;
  long lVar22;
  undefined4 uVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  int nodeStack [64];
  ulong local_168;
  uint local_160;
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  anon_union_4_2_b6662c1c_for_LinearBVHNode_1 aaStack_138 [66];
  
  auVar3._0_8_ = (ray->d).x;
  auVar3._8_8_ = (ray->d).y;
  local_148 = divpd(_DAT_001880c0,auVar3);
  dVar29 = 1.0 / (ray->d).z;
  lVar21 = -(ulong)(local_148._0_8_ < 0.0);
  lVar22 = -(ulong)(local_148._8_8_ < 0.0);
  uVar23 = (undefined4)lVar22;
  local_168 = CONCAT44(uVar23,(int)lVar21) & 0x100000001;
  auVar6._8_4_ = uVar23;
  auVar6._0_8_ = lVar21;
  local_158._12_4_ = (int)((ulong)lVar22 >> 0x20);
  local_158._0_12_ = auVar6;
  uVar18 = 0;
  bVar20 = (auVar6 & (undefined1  [12])0x1) != (undefined1  [12])0x0;
  lVar21 = 0;
  if (bVar20) {
    lVar21 = 0x18;
  }
  uVar11 = 0x18;
  if (bVar20) {
    uVar11 = uVar18;
  }
  bVar20 = (auVar6 & (undefined1  [12])0x1) != (undefined1  [12])0x0;
  lVar22 = 0;
  if (bVar20) {
    lVar22 = 0x18;
  }
  uVar19 = 0x18;
  if (bVar20) {
    uVar19 = uVar18;
  }
  lVar15 = 0;
  if (dVar29 < 0.0) {
    lVar15 = 0x18;
  }
  local_160 = (uint)(dVar29 < 0.0);
  uVar16 = 0x18;
  if (dVar29 < 0.0) {
    uVar16 = uVar18;
  }
  iVar10 = 0;
  bVar13 = 0;
  do {
    pLVar4 = this->bvhNodes;
    dVar8 = (ray->o).x;
    dVar9 = (ray->o).y;
    dVar1 = (ray->o).z;
    dVar2 = ray->tMax;
LAB_00130e07:
    while( true ) {
      dVar24 = (*(double *)(pLVar4[iVar10]._padding + lVar21 + -0x37) - dVar8) * local_148._0_8_;
      dVar25 = (*(double *)(pLVar4[iVar10]._padding + lVar22 + -0x2f) - dVar9) * local_148._8_8_;
      dVar26 = (*(double *)(pLVar4[iVar10]._padding + (uVar11 - 0x37)) - dVar8) * local_148._0_8_ *
               1.0000000000000007;
      dVar27 = (*(double *)(pLVar4[iVar10]._padding + (uVar19 - 0x2f)) - dVar9) * local_148._8_8_ *
               1.0000000000000007;
      auVar7._8_8_ = -(ulong)(dVar27 < dVar24);
      auVar7._0_8_ = -(ulong)(dVar26 < dVar25);
      iVar14 = movmskpd(iVar10,auVar7);
      iVar17 = (int)uVar18;
      if (iVar14 == 0) break;
LAB_00130e5c:
      if (iVar17 == 0) goto LAB_00130fdb;
      uVar18 = (ulong)(iVar17 - 1);
      iVar10 = aaStack_138[(long)iVar17 + -1].objectStartIdx;
    }
    if (dVar26 <= dVar27) {
      dVar27 = dVar26;
    }
    dVar28 = (*(double *)(pLVar4[iVar10]._padding + lVar15 + -0x27) - dVar1) * dVar29;
    dVar26 = (*(double *)(pLVar4[iVar10]._padding + (uVar16 - 0x27)) - dVar1) * dVar29 *
             1.0000000000000007;
    if (dVar27 < dVar28) goto LAB_00130e5c;
    if (dVar25 <= dVar24) {
      dVar25 = dVar24;
    }
    if (dVar26 < dVar25) goto LAB_00130e5c;
    if (dVar28 <= dVar25) {
      dVar28 = dVar25;
    }
    if (dVar2 <= dVar28) goto LAB_00130e5c;
    if (dVar27 <= dVar26) {
      dVar26 = dVar27;
    }
    if (dVar26 <= 0.0) goto LAB_00130e5c;
    if (pLVar4[iVar10].nObjects == 0) {
      if (*(int *)((long)&local_168 + (ulong)pLVar4[iVar10].splitAxis * 4) == 0) {
        uVar18 = (ulong)(iVar17 + 1);
        aaStack_138[iVar17] = pLVar4[iVar10].field_1;
        iVar10 = iVar10 + 1;
      }
      else {
        uVar18 = (ulong)(iVar17 + 1);
        aaStack_138[iVar17].objectStartIdx = iVar10 + 1;
        iVar10 = pLVar4[iVar10].field_1.objectStartIdx;
      }
      goto LAB_00130e07;
    }
    lVar12 = 0;
    do {
      peVar5 = (this->objectList).
               super__Vector_base<std::shared_ptr<phyr::Object>,_std::allocator<std::shared_ptr<phyr::Object>_>_>
               ._M_impl.super__Vector_impl_data._M_start
               [pLVar4[iVar10].field_1.objectStartIdx + lVar12].
               super___shared_ptr<phyr::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      iVar14 = (*peVar5->_vptr_Object[4])(peVar5,ray,si);
      bVar13 = bVar13 | (byte)iVar14;
      lVar12 = lVar12 + 1;
    } while ((uint)lVar12 < (uint)pLVar4[iVar10].nObjects);
    if (iVar17 == 0) {
LAB_00130fdb:
      return (bool)(bVar13 & 1);
    }
    uVar18 = (ulong)(iVar17 - 1);
    iVar10 = aaStack_138[(long)iVar17 + -1].objectStartIdx;
  } while( true );
}

Assistant:

bool AccelBVH::intersectRay(const Ray& ray, SurfaceInteraction* si) const {
    bool intersected = false;
    // Initialize ray intersection parameters
    Vector3f invDir(1 / ray.d.x, 1 / ray.d.y, 1 / ray.d.z);
    int isDirNeg[3] = { invDir.x < 0, invDir.y < 0, invDir.z < 0 };

    // Test against each BVH node
    int nodeStack[64];
    int stackSize = 0, itrIdx = 0, i;

    while (true) {
        const LinearBVHNode* node = &bvhNodes[itrIdx];
        // Inspect current node
        if (node->bounds.intersectRay(ray, invDir, isDirNeg)) {
            if (node->nObjects > 0) {
                // Node is leaf. Test against all objects in leaf
                for (i = 0; i < node->nObjects; i++)
                    if (objectList[node->objectStartIdx + i]->intersectRay(ray, si))
                        intersected = true;
                if (stackSize == 0) break;
                itrIdx = nodeStack[--stackSize];
            } else {
                // Internal node. Test near nodes first. Put far nodes in the stack
                if (isDirNeg[node->splitAxis]) {
                    // Stash first child and inspect second child first
                    nodeStack[stackSize++] = itrIdx + 1;
                    itrIdx = node->secondChildIdx;
                } else {
                    // Stash second child and inspect first child first
                    nodeStack[stackSize++] = node->secondChildIdx;
                    itrIdx++;
                }
            }
        } else {
            if (stackSize == 0) break;
            itrIdx = nodeStack[--stackSize];
        }
    }

    return intersected;
}